

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void primaryexp(LexState *ls,expdesc *v)

{
  long in_RDI;
  expdesc key_1;
  expdesc key;
  FuncState *fs;
  FuncState *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar1;
  expdesc *in_stack_ffffffffffffffb8;
  LexState *in_stack_ffffffffffffffc0;
  expdesc *in_stack_ffffffffffffffc8;
  FuncState *in_stack_ffffffffffffffd0;
  expdesc *in_stack_ffffffffffffffd8;
  LexState *in_stack_ffffffffffffffe0;
  
  prefixexp((LexState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
            (expdesc *)in_stack_ffffffffffffffa8);
LAB_00117b7b:
  do {
    while (iVar1 = *(int *)(in_RDI + 0x10), iVar1 == 0x28) {
LAB_00117c5c:
      luaK_exp2nextreg((FuncState *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                       (expdesc *)in_stack_ffffffffffffffa8);
      funcargs(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
    if (iVar1 != 0x2e) {
      if (iVar1 == 0x3a) {
        luaX_next((LexState *)0x117c28);
        checkname(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        luaK_self(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                  (expdesc *)in_stack_ffffffffffffffc0);
        funcargs(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      }
      else {
        if (iVar1 != 0x5b) {
          if ((iVar1 != 0x7b) && (iVar1 != 0x11e)) {
            return;
          }
          goto LAB_00117c5c;
        }
        luaK_exp2anyreg(in_stack_ffffffffffffffa8,(expdesc *)0x117bf9);
        yindex((LexState *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
               (expdesc *)in_stack_ffffffffffffffa8);
        luaK_indexed((FuncState *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                     (expdesc *)in_stack_ffffffffffffffa8,(expdesc *)0x117c1c);
      }
      goto LAB_00117b7b;
    }
    field((LexState *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  } while( true );
}

Assistant:

static void primaryexp(LexState*ls,expdesc*v){
FuncState*fs=ls->fs;
prefixexp(ls,v);
for(;;){
switch(ls->t.token){
case'.':{
field(ls,v);
break;
}
case'[':{
expdesc key;
luaK_exp2anyreg(fs,v);
yindex(ls,&key);
luaK_indexed(fs,v,&key);
break;
}
case':':{
expdesc key;
luaX_next(ls);
checkname(ls,&key);
luaK_self(fs,v,&key);
funcargs(ls,v);
break;
}
case'(':case TK_STRING:case'{':{
luaK_exp2nextreg(fs,v);
funcargs(ls,v);
break;
}
default:return;
}
}
}